

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O1

_Bool sesschan_run_subsystem(Channel *chan,ptrlen subsys)

{
  _Bool _Var1;
  undefined8 uVar2;
  
  _Var1 = ptrlen_eq_string(subsys,"sftp");
  if ((_Var1) && (*(undefined8 **)&chan[-0x5c].initial_fixed_window_size != (undefined8 *)0x0)) {
    uVar2 = (*(code *)**(undefined8 **)&chan[-0x5c].initial_fixed_window_size)();
    *(undefined8 *)&chan[-2].initial_fixed_window_size = uVar2;
    chan->vt = &sftp_channelvt;
    logevent((LogContext *)chan[-0x5d].vt,"Starting built-in SFTP subsystem");
    _Var1 = true;
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool sesschan_run_subsystem(Channel *chan, ptrlen subsys)
{
    sesschan *sess = container_of(chan, sesschan, chan);

    if (ptrlen_eq_string(subsys, "sftp") && sess->sftpserver_vt) {
        sess->sftpsrv = sftpsrv_new(sess->sftpserver_vt);
        sess->chan.vt = &sftp_channelvt;
        logevent(sess->parent_logctx, "Starting built-in SFTP subsystem");
        return true;
    }

    return false;
}